

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent.capnp.h
# Opt level: O2

Promise<void> __thiscall
capnp::Persistent<capnp::Text,_capnp::AnyPointer>::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  long lVar1;
  PromiseNode *extraout_RDX;
  undefined6 in_register_00000032;
  Promise<void> PVar3;
  PromiseNode *pPVar2;
  
  lVar1 = *(long *)CONCAT62(in_register_00000032,methodId);
  if ((int)context.hook == 0) {
    (**(code **)(lVar1 + 8))(this);
    pPVar2 = extraout_RDX;
  }
  else {
    PVar3 = Capability::Server::internalUnimplemented
                      ((Server *)this,
                       (char *)((long)CONCAT62(in_register_00000032,methodId) +
                               *(long *)(lVar1 + -0x18)),0x4f9516,0x5691);
    pPVar2 = PVar3.super_PromiseBase.node.ptr;
  }
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar3.super_PromiseBase.node;
}

Assistant:

::kj::Promise<void> Persistent<SturdyRef, Owner>::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return save(::capnp::Capability::Server::internalGetTypedContext<
          typename  ::capnp::Persistent<SturdyRef, Owner>::SaveParams, typename  ::capnp::Persistent<SturdyRef, Owner>::SaveResults>(context));
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/persistent.capnp:Persistent",
          0xc8cb212fcd9f5691ull, methodId);
  }
}